

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O1

bool ON_BrepExtrudeHelper_MakeSides
               (ON_Brep *brep,int loop_index,ON_Curve *path_curve,bool bCap,
               ON_SimpleArray<int> *side_face_index)

{
  int iVar1;
  ON_BrepTrim *pOVar2;
  ON_BrepEdge *pOVar3;
  ON_SumSurface *pSurface;
  ON_BrepFace *pOVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  size_t new_capacity;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  int vid [4];
  int eid [4];
  uint local_80;
  undefined4 local_7c;
  ON_Brep *local_78;
  ON_SimpleArray<int> *local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  int iStack_3c;
  ON_Curve *local_38;
  
  uVar11 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
           [loop_index].m_ti.m_count;
  uVar9 = (ulong)uVar11;
  if (uVar9 != 0) {
    local_64 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
               m_count;
    local_60 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
               m_count;
    local_78 = brep;
    local_38 = path_curve;
    ON_BrepExtrudeHelper_ReserveSpace(brep,uVar11,(uint)bCap);
    new_capacity = (long)(int)uVar11 + (long)side_face_index->m_count;
    if ((uint)side_face_index->m_capacity < (uint)new_capacity) {
      ON_SimpleArray<int>::SetCapacity(side_face_index,new_capacity);
    }
    if (0 < (int)uVar11) {
      uVar11 = 0xffffffff;
      uVar10 = 0;
      local_80 = 0xffffffff;
      local_70 = side_face_index;
      do {
        local_5c = -1;
        ON_SimpleArray<int>::Append(side_face_index,&local_5c);
        iVar1 = (local_78->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                m_a[loop_index].m_ti.m_a[uVar10];
        lVar5 = (long)iVar1;
        if ((-1 < lVar5) && (iVar1 < local_60)) {
          local_58 = -1;
          iStack_54 = -1;
          iStack_50 = -1;
          iStack_4c = -1;
          local_48 = -1;
          iStack_44 = -1;
          uStack_40 = 0xffffffff;
          iStack_3c = -1;
          local_7c = 0;
          pOVar2 = (local_78->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                   super_ON_ClassArray<ON_BrepTrim>.m_a;
          lVar6 = (long)pOVar2[lVar5].m_ei;
          pSurface = (ON_SumSurface *)0x0;
          bVar12 = false;
          if ((-1 < lVar6) && (pOVar2[lVar5].m_ei < local_64)) {
            bVar12 = pOVar2[lVar5].m_type == seam;
            if (bVar12) {
              uVar11 = 0xffffffff;
              pSurface = (ON_SumSurface *)0x0;
            }
            else {
              pOVar3 = (local_78->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                       super_ON_ClassArray<ON_BrepEdge>.m_a;
              local_58 = pOVar2[lVar5].m_vi[1];
              iStack_54 = pOVar2[lVar5].m_vi[0];
              local_48 = pOVar3[lVar6].m_edge_index;
              local_7c = pOVar2[lVar5].m_bRev3d ^ 1;
              pSurface = ON_BrepExtrudeHelper_MakeSumSrf
                                   (local_38,pOVar3 + lVar6,pOVar2[lVar5].m_bRev3d);
            }
          }
          side_face_index = local_70;
          if ((pSurface != (ON_SumSurface *)0x0) && (!bVar12)) {
            if (-1 < (int)uVar11) {
              pOVar2 = (local_78->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                       super_ON_ClassArray<ON_BrepTrim>.m_a;
              iVar1 = (local_78->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                      super_ON_ClassArray<ON_BrepLoop>.m_a
                      [*(local_78->m_F).super_ON_ObjectArray<ON_BrepFace>.
                        super_ON_ClassArray<ON_BrepFace>.m_a[uVar11].m_li.m_a].m_ti.m_a[3];
              iStack_50 = pOVar2[iVar1].m_vi[0];
              iStack_44 = pOVar2[iVar1].m_ei;
              local_7c = CONCAT22(local_7c._2_2_,CONCAT11(pOVar2[iVar1].m_bRev3d,local_7c._0_1_)) ^
                         0x100;
            }
            if (-1 < (int)local_80) {
              pOVar2 = (local_78->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                       super_ON_ClassArray<ON_BrepTrim>.m_a;
              uVar7 = (ulong)local_80;
              if (pOVar2[uVar7].m_vi[0] == local_58) {
                iStack_4c = pOVar2[uVar7].m_vi[1];
                iStack_3c = pOVar2[uVar7].m_ei;
                local_7c = CONCAT13(pOVar2[uVar7].m_bRev3d,(undefined3)local_7c) ^ 0x1000000;
              }
            }
            pOVar4 = ON_Brep::NewFace(local_78,&pSurface->super_ON_Surface,&local_58,&local_48,
                                      (bool *)&local_7c);
            side_face_index = local_70;
            if (pOVar4 != (ON_BrepFace *)0x0) {
              piVar8 = local_70->m_a + (long)local_70->m_count + -1;
              if ((long)local_70->m_count < 1) {
                piVar8 = (int *)0x0;
              }
              *piVar8 = pOVar4->m_face_index;
              uVar11 = pOVar4->m_face_index;
              if ((int)local_80 < 0) {
                local_80 = (local_78->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_a[*(pOVar4->m_li).m_a].m_ti.m_a[1];
              }
            }
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  return uVar9 != 0;
}

Assistant:

static
bool ON_BrepExtrudeHelper_MakeSides(
          ON_Brep& brep,
          int loop_index,
          const ON_Curve& path_curve,
          bool bCap,
          ON_SimpleArray<int>& side_face_index
          )
{
  int lti, ti, i, vid[4], eid[4];
  bool bRev3d[4];

  // indices of new faces appended to the side_face_index[] array 
  // (1 face index for each trim, -1 is used for singular trims)

  // count number of new objects so we can grow arrays
  // efficiently and use refs to dynamic array elements.
  const int loop_trim_count = brep.m_L[loop_index].m_ti.Count();
  if ( loop_trim_count == 0 )
    return false;

  // save input trim and edge counts for use below
  const int trim_count0 = brep.m_T.Count();
  const int edge_count0 = brep.m_E.Count();

  ON_BrepExtrudeHelper_ReserveSpace( brep, loop_trim_count, bCap?1:0 );

  side_face_index.Reserve( side_face_index.Count() + loop_trim_count); // index of new face above brep.m_L[loop_index].m_ti[lti]
  int prev_face_index = -1;
  int first_face_east_trim_index = -1;

  for ( lti = 0; lti < loop_trim_count; lti++ )
  {
    ON_SumSurface* sum_srf = 0;
    side_face_index.Append(-1);
    ti = brep.m_L[loop_index].m_ti[lti];
    if ( ti < 0 || ti >= trim_count0 )
      continue;

    for ( i = 0; i < 4; i++ )
    {
      vid[i] = -1;
      eid[i] = -1;
    }
    bRev3d[0] = false;
    bRev3d[1] = false;
    bRev3d[2] = false;
    bRev3d[3] = false;

    // get side surface for new face
    {
      ON_BrepTrim& trim = brep.m_T[ti];
      if ( trim.m_ei >= 0 &&  trim.m_ei < edge_count0 )
      {
        const ON_BrepEdge& base_edge = brep.m_E[trim.m_ei];

        // 5 September, 2003 Dale Lear
        //   do not extrude seams - fixes rectangle slabe bug
        if ( trim.m_type == ON_BrepTrim::seam )
        {
          prev_face_index = -1;
          continue;
        }

        // connect new face to existing topology on trim
        vid[0] = trim.m_vi[1];
        vid[1] = trim.m_vi[0];
        eid[0] = base_edge.m_edge_index;
        bRev3d[0] = (trim.m_bRev3d?false:true);
        sum_srf = ON_BrepExtrudeHelper_MakeSumSrf( path_curve, base_edge, trim.m_bRev3d );
      }
    }
    if ( !sum_srf )
      continue;

    if ( prev_face_index >= 0 )
    {
      const ON_BrepTrim& prev_west_trim = brep.m_T[ brep.m_L[ brep.m_F[prev_face_index].m_li[0]].m_ti[3] ];
      vid[2] = prev_west_trim.m_vi[0];
      eid[1] = prev_west_trim.m_ei;
      bRev3d[1] = (prev_west_trim.m_bRev3d?false:true);
    }
    if ( first_face_east_trim_index >= 0 && brep.m_T[first_face_east_trim_index].m_vi[0] == vid[0] )
    {
      const ON_BrepTrim& first_face_east_trim = brep.m_T[first_face_east_trim_index];
      vid[3] = first_face_east_trim.m_vi[1];
      eid[3] = first_face_east_trim.m_ei;
      bRev3d[3] = (first_face_east_trim.m_bRev3d?false:true);
    }
    const ON_BrepFace* side_face = brep.NewFace(sum_srf,vid,eid,bRev3d);
    if ( side_face )
    {
      *side_face_index.Last() = side_face->m_face_index;
      prev_face_index = side_face->m_face_index;
      if ( first_face_east_trim_index < 0 )
        first_face_east_trim_index = brep.m_L[ side_face->m_li[0] ].m_ti[1];
    }
  }

  return true;
}